

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManPermuteInputs(Gia_Man_t *p,int nPpis,int nExtra)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  iVar5 = p->vCis->nSize;
  uVar11 = iVar5 - p->nRegs;
  iVar10 = nPpis + nExtra;
  if (0 < (int)(uVar11 - iVar10)) {
    lVar12 = 0;
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e7804;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e7804;
      iVar5 = p->vCis->nSize;
      if (iVar5 <= lVar12) goto LAB_001e7842;
      iVar1 = p->vCis->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e7823;
      p->pObjs[iVar1].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      uVar11 = iVar5 - p->nRegs;
    } while (lVar12 < (int)(uVar11 - iVar10));
  }
  if (0 < nExtra) {
    uVar14 = uVar11 - nExtra;
    uVar13 = (ulong)uVar14;
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e7804;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e7804;
      if ((int)uVar14 < 0) goto LAB_001e7842;
      iVar5 = p->vCis->nSize;
      if (iVar5 <= (int)uVar13) goto LAB_001e7842;
      iVar1 = p->vCis->pArray[uVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e7823;
      p->pObjs[iVar1].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      uVar13 = uVar13 + 1;
      uVar11 = iVar5 - p->nRegs;
    } while ((int)uVar13 < (int)uVar11);
  }
  uVar14 = uVar11 - iVar10;
  if ((int)uVar14 < (int)(uVar11 - nExtra)) {
    uVar13 = (ulong)uVar14;
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e7804;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e7804;
      if ((int)uVar14 < 0) goto LAB_001e7842;
      iVar5 = p->vCis->nSize;
      if (iVar5 <= (int)uVar13) goto LAB_001e7842;
      iVar10 = p->vCis->pArray[uVar13];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_001e7823;
      p->pObjs[iVar10].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      uVar11 = iVar5 - p->nRegs;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < (int)(uVar11 - nExtra));
  }
  if ((int)uVar11 < iVar5) {
    uVar13 = (ulong)uVar11;
    do {
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_001e7804:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_001e7804;
      if ((int)uVar11 < 0) {
LAB_001e7842:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p->vCis->nSize;
      if (iVar5 <= (int)uVar13) goto LAB_001e7842;
      iVar10 = p->vCis->pArray[uVar13];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_001e7823;
      p->pObjs[iVar10].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < iVar5);
  }
  if (p_00->vCis->nSize != iVar5) {
    __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x9bf,"Gia_Man_t *Gia_ManPermuteInputs(Gia_Man_t *, int, int)");
  }
  iVar5 = p->nObjs;
  if (0 < iVar5) {
    lVar15 = 8;
    lVar12 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar3 + lVar15 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar11 = *(uint *)((long)pGVar3 +
                          lVar15 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar11 < 0) ||
           (uVar14 = *(uint *)((long)pGVar3 +
                              lVar15 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_001e7861;
        iVar5 = Gia_ManAppendAnd(p_00,uVar11 ^ (uint)(uVar13 >> 0x1d) & 1,
                                 uVar14 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar15) = iVar5;
        iVar5 = p->nObjs;
      }
      lVar12 = lVar12 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar12 < iVar5);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar12];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_001e7823:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar5;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001e7861:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar11;
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManPermuteInputs( Gia_Man_t * p, int nPpis, int nExtra )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    for ( i = 0; i < Gia_ManPiNum(p) - nPpis - nExtra; i++ ) // regular PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nExtra; i < Gia_ManPiNum(p); i++ ) // extra PIs due to DC values
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p) - nPpis - nExtra; i < Gia_ManPiNum(p) - nExtra; i++ ) // pseudo-PIs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    for ( i = Gia_ManPiNum(p); i < Gia_ManCiNum(p); i++ ) // flop outputs
        Gia_ManCi(p, i)->Value = Gia_ManAppendCi( pNew );
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}